

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O1

bool __thiscall
HighsMipSolverData::checkSolution
          (HighsMipSolverData *this,vector<double,_std::allocator<double>_> *solution)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  HighsLp *pHVar4;
  double *pdVar5;
  double *pdVar6;
  pointer pdVar7;
  pointer piVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  double __x;
  double dVar13;
  double dVar14;
  
  pHVar4 = this->mipsolver->model_;
  uVar1 = pHVar4->num_col_;
  bVar12 = (ulong)uVar1 == 0;
  if (!bVar12) {
    pdVar5 = (solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (pHVar4->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar14 = this->feastol;
    __x = *pdVar5;
    if (*pdVar6 - dVar14 <= __x) {
      pdVar7 = (pHVar4->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = 0;
      do {
        if ((pdVar7[lVar11] + dVar14 < __x) ||
           (((pHVar4->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar11] == kInteger &&
            (dVar13 = round(__x), dVar14 < ABS(__x - dVar13))))) break;
        bVar12 = (ulong)uVar1 - 1 == lVar11;
        if (bVar12) goto LAB_002baf1c;
        __x = pdVar5[lVar11 + 1];
        lVar9 = lVar11 + 1;
        lVar11 = lVar11 + 1;
      } while (pdVar6[lVar9] - dVar14 <= __x);
    }
    if (!bVar12) {
      return false;
    }
  }
LAB_002baf1c:
  piVar8 = (this->ARstart_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = 0;
  while( true ) {
    bVar12 = uVar10 == (uint)pHVar4->num_row_;
    if (bVar12) {
      return bVar12;
    }
    iVar2 = piVar8[uVar10];
    iVar3 = piVar8[uVar10 + 1];
    dVar14 = 0.0;
    if (iVar3 != iVar2) {
      lVar11 = 0;
      do {
        dVar14 = dVar14 + (solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start
                          [(this->ARindex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar2 + lVar11]] *
                          (this->ARvalue_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[iVar2 + lVar11];
        lVar11 = lVar11 + 1;
      } while (iVar3 - iVar2 != (int)lVar11);
    }
    if ((pHVar4->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar10] + this->feastol < dVar14) break;
    pdVar5 = (pHVar4->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + uVar10;
    uVar10 = uVar10 + 1;
    if (dVar14 < *pdVar5 - this->feastol) {
      return bVar12;
    }
  }
  return bVar12;
}

Assistant:

bool HighsMipSolverData::checkSolution(
    const std::vector<double>& solution) const {
  for (HighsInt i = 0; i != mipsolver.model_->num_col_; ++i) {
    if (solution[i] < mipsolver.model_->col_lower_[i] - feastol) return false;
    if (solution[i] > mipsolver.model_->col_upper_[i] + feastol) return false;
    if (mipsolver.variableType(i) == HighsVarType::kInteger &&
        fractionality(solution[i]) > feastol)
      return false;
  }

  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    double rowactivity = 0.0;

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];

    for (HighsInt j = start; j != end; ++j)
      rowactivity += solution[ARindex_[j]] * ARvalue_[j];

    if (rowactivity > mipsolver.rowUpper(i) + feastol) return false;
    if (rowactivity < mipsolver.rowLower(i) - feastol) return false;
  }

  return true;
}